

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  stbtt__csctx local_68;
  
  if ((font->cff).size == 0) {
    uVar3 = stbtt__GetGlyfOffset(font,glyph);
    if ((int)uVar3 < 0) {
      if (ix0 != (int *)0x0) {
        *ix0 = 0;
      }
      if (iy0 != (int *)0x0) {
        *iy0 = 0;
      }
      if (ix1 != (int *)0x0) {
        *ix1 = 0;
      }
      iVar4 = 0;
      if (iy1 == (int *)0x0) {
        return;
      }
      goto LAB_00135e60;
    }
    puVar1 = font->data;
    uVar2 = (int)(short)((ushort)puVar1[(ulong)uVar3 + 2] << 8) | (uint)puVar1[(ulong)uVar3 + 3];
    uVar6 = (int)(short)((ushort)puVar1[(ulong)uVar3 + 4] << 8) | (uint)puVar1[(ulong)uVar3 + 5];
    uVar5 = (int)(short)((ushort)puVar1[(ulong)uVar3 + 6] << 8) | (uint)puVar1[(ulong)uVar3 + 7];
    uVar3 = (int)(short)((ushort)puVar1[(ulong)uVar3 + 8] << 8) | (uint)puVar1[(ulong)uVar3 + 9];
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    uVar2 = stbtt__run_charstring(font,glyph,&local_68);
    uVar6 = uVar2;
    uVar5 = uVar2;
    uVar3 = uVar2;
    if (uVar2 != 0) {
      uVar2 = local_68.min_x;
      uVar6 = local_68.min_y;
      uVar5 = local_68.max_x;
      uVar3 = local_68.max_y;
    }
  }
  if (ix0 != (int *)0x0) {
    fVar7 = (float)(int)uVar2 * scale_x + 0.0;
    *ix0 = (int)(float)(int)((int)fVar7 - (uint)(fVar7 < 0.0 && (float)(int)fVar7 != fVar7));
  }
  if (iy0 != (int *)0x0) {
    fVar7 = (float)(int)-uVar3 * scale_y + 0.0;
    *iy0 = (int)(float)(int)((int)fVar7 - (uint)(fVar7 < 0.0 && (float)(int)fVar7 != fVar7));
  }
  if (ix1 != (int *)0x0) {
    fVar7 = ceilf((float)(int)uVar5 * scale_x + 0.0);
    *ix1 = (int)fVar7;
  }
  if (iy1 == (int *)0x0) {
    return;
  }
  fVar7 = ceilf((float)(int)-uVar6 * scale_y + 0.0);
  iVar4 = (int)fVar7;
LAB_00135e60:
  *iy1 = iVar4;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}